

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O0

png_fixed_point png_get_y_offset_inches_fixed(png_const_structrp png_ptr,png_const_inforp info_ptr)

{
  png_int_32 microns;
  png_fixed_point pVar1;
  png_const_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  microns = png_get_y_offset_microns(png_ptr,info_ptr);
  pVar1 = png_fixed_inches_from_microns(png_ptr,microns);
  return pVar1;
}

Assistant:

png_fixed_point PNGAPI
png_get_y_offset_inches_fixed(png_const_structrp png_ptr,
    png_const_inforp info_ptr)
{
   return png_fixed_inches_from_microns(png_ptr,
       png_get_y_offset_microns(png_ptr, info_ptr));
}